

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O1

Vec_Ptr_t * collectUserGivenDisjunctiveMonotoneSignals(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  void **ppvVar7;
  int iVar8;
  long lVar9;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 0;
  pVVar3->nSize = 0;
  pVVar3->pArray = (void **)0x0;
  pVVar4 = pNtk->vPos;
  if (0 < pVVar4->nSize) {
    lVar9 = 0;
    do {
      pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar4->pArray[lVar9]);
      pcVar5 = strstr(pcVar5,"csLevel1Stabil_");
      if (pcVar5 != (char *)0x0) {
        pVVar6 = createSingletonIntVector((int)lVar9);
        uVar1 = pVVar3->nSize;
        uVar2 = pVVar3->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar7;
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar2 * 2;
            if (iVar8 <= (int)uVar2) goto LAB_0062a8cf;
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
            }
            pVVar3->pArray = ppvVar7;
          }
          pVVar3->nCap = iVar8;
        }
LAB_0062a8cf:
        pVVar3->nSize = uVar1 + 1;
        pVVar3->pArray[(int)uVar1] = pVVar6;
      }
      lVar9 = lVar9 + 1;
      pVVar4 = pNtk->vPos;
    } while (lVar9 < pVVar4->nSize);
  }
  pVVar4 = (Vec_Ptr_t *)0x0;
  if (0 < pVVar3->nSize) {
    pVVar4 = pVVar3;
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t *collectUserGivenDisjunctiveMonotoneSignals( Abc_Ntk_t *pNtk )
{
    Abc_Obj_t *pObj;
    int i;
    Vec_Ptr_t *monotoneVector;
    Vec_Int_t *newIntVector;

    monotoneVector = Vec_PtrAlloc(0);    
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if( strstr( Abc_ObjName( pObj ), "csLevel1Stabil_" ) != NULL )
        {
            newIntVector = createSingletonIntVector(i);
            Vec_PtrPush(monotoneVector, newIntVector);
        }
    }

    if( Vec_PtrSize(monotoneVector) > 0 )
        return monotoneVector;
    else
        return NULL;

}